

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::StartTracingResponse::ParseFromArray
          (StartTracingResponse *this,void *raw,size_t size)

{
  byte bVar1;
  uint uVar2;
  ulong *puVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong *puVar7;
  ulong *puVar8;
  ulong *puVar9;
  bool bVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  ulong *puVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  ulong local_58;
  Field local_48;
  ulong *local_38;
  
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar8 = (ulong *)(size + (long)raw);
  do {
    lVar4 = 7;
    if (puVar8 <= raw) goto LAB_0026d687;
    uVar12 = (ulong)(char)(byte)*raw;
    puVar7 = (ulong *)((long)raw + 1);
    if ((long)uVar12 < 0) {
      bVar1 = (byte)*raw;
      uVar6 = (ulong)(bVar1 & 0x7f);
      bVar10 = false;
      puVar3 = puVar7;
      for (; (uVar12 = uVar6, puVar9 = puVar3, (char)bVar1 < '\0' &&
             (bVar18 = 0x38 < lVar4 - 7U, bVar10 = bVar18 || puVar8 <= puVar3, uVar12 = 0,
             puVar9 = puVar7, !bVar18 && puVar8 > puVar3)); lVar4 = lVar4 + 7) {
        bVar1 = (byte)*puVar3;
        puVar3 = (ulong *)((long)puVar3 + 1);
        uVar6 = uVar6 | (ulong)(bVar1 & 0x7f) << ((byte)lVar4 & 0x3f);
      }
      puVar7 = puVar9;
      if (bVar10) {
        puVar7 = (ulong *)raw;
        uVar12 = 0;
      }
      if (puVar7 == (ulong *)raw) goto LAB_0026d687;
    }
    uVar5 = (uint)(uVar12 >> 3);
    if (((uVar5 == 0) || (puVar8 <= puVar7)) || (5 < ((byte)uVar12 & 7))) {
switchD_0026d4e8_caseD_3:
      bVar10 = false;
      uVar12 = 0;
      puVar3 = (ulong *)raw;
      uVar6 = 0;
    }
    else {
      uVar2 = (uint)uVar12 & 7;
      puVar3 = (ulong *)((long)&switchD_0026d4e8::switchdataD_0034f4d0 +
                        (long)(int)(&switchD_0026d4e8::switchdataD_0034f4d0)[uVar2]);
      switch(uVar2) {
      case 0:
        uVar11 = 0;
        bVar10 = puVar7 >= puVar8;
        if (puVar7 < puVar8) {
          puVar9 = (ulong *)((long)puVar7 + 1);
          bVar1 = (byte)*puVar7;
          uVar17 = (ulong)(bVar1 & 0x7f);
          uVar6 = 0;
          uVar15 = uVar17;
          if ((char)bVar1 < '\0') {
            uVar15 = 0;
          }
          uVar2 = (uint)uVar15;
          puVar3 = puVar9;
          if ((char)bVar1 < '\0') {
            uVar6 = 0;
            lVar4 = 7;
            puVar14 = puVar9;
            do {
              uVar2 = (uint)uVar15;
              bVar10 = 0x38 < lVar4 - 7U || puVar8 <= puVar14;
              puVar3 = puVar9;
              if (bVar10) break;
              bVar1 = (byte)*puVar14;
              puVar3 = (ulong *)((long)puVar14 + 1);
              uVar17 = uVar17 | (ulong)(bVar1 & 0x7f) << ((byte)lVar4 & 0x3f);
              lVar4 = lVar4 + 7;
              if ((char)bVar1 >= '\0') {
                uVar15 = uVar17 & 0xffffffff;
                uVar6 = uVar17 >> 0x20;
              }
              uVar2 = (uint)uVar15;
              puVar14 = puVar3;
            } while ((char)bVar1 < '\0');
          }
        }
        else {
          uVar6 = 0;
          uVar2 = 0;
        }
        if (bVar10) {
          uVar6 = 0;
          puVar3 = puVar7;
          uVar2 = 0;
        }
        if (puVar3 != puVar7) goto LAB_0026d6c0;
        uVar12 = 0;
        bVar10 = false;
        puVar3 = (ulong *)raw;
        uVar6 = uVar11;
        goto LAB_0026d701;
      case 1:
        puVar3 = puVar7 + 1;
        if (puVar8 < puVar3) {
LAB_0026d687:
          uVar12 = 0;
          bVar10 = false;
          puVar3 = (ulong *)raw;
          uVar6 = 0;
          goto LAB_0026d701;
        }
        uVar11 = *puVar7;
        uVar6 = uVar11 >> 0x20;
        break;
      case 2:
        bVar10 = puVar7 >= puVar8;
        uVar11 = local_58;
        if (puVar7 < puVar8) {
          puVar9 = (ulong *)((long)puVar7 + 1);
          uVar6 = (ulong)((byte)*puVar7 & 0x7f);
          puVar3 = puVar9;
          uVar11 = uVar6;
          if ((char)(byte)*puVar7 < '\0') {
            lVar4 = 7;
            puVar14 = puVar9;
            do {
              bVar10 = 0x38 < lVar4 - 7U || puVar8 <= puVar14;
              puVar3 = puVar9;
              uVar11 = local_58;
              if (bVar10) break;
              uVar15 = *puVar14;
              puVar3 = (ulong *)((long)puVar14 + 1);
              uVar6 = uVar6 | (ulong)((byte)uVar15 & 0x7f) << ((byte)lVar4 & 0x3f);
              lVar4 = lVar4 + 7;
              uVar11 = uVar6;
              puVar14 = puVar3;
            } while ((char)(byte)uVar15 < '\0');
          }
        }
        uVar6 = 0;
        local_58 = uVar11;
        if (bVar10) {
          puVar3 = puVar7;
          local_58 = uVar6;
        }
        if (puVar3 == puVar7) {
          uVar2 = 0;
          bVar10 = false;
          uVar11 = 0;
        }
        else {
          bVar10 = local_58 <= (ulong)((long)puVar8 - (long)puVar3);
          if (bVar10) {
            uVar6 = (ulong)puVar3 >> 0x20;
            uVar2 = (uint)puVar3;
            puVar3 = (ulong *)((long)puVar3 + local_58);
            uVar11 = local_58;
          }
          else {
            uVar6 = 0;
            uVar2 = 0;
            uVar11 = 0;
          }
        }
        local_38 = puVar7;
        if (!bVar10) goto LAB_0026d687;
        goto LAB_0026d6c0;
      default:
        goto switchD_0026d4e8_caseD_3;
      case 5:
        puVar3 = (ulong *)((long)puVar7 + 4);
        uVar6 = 0;
        if (puVar8 < puVar3) goto LAB_0026d687;
        uVar11 = (ulong)(uint)*puVar7;
      }
      uVar2 = (uint)uVar11;
      uVar11 = 0;
LAB_0026d6c0:
      bVar10 = true;
      if ((uVar5 < 0x10000) && (uVar11 < 0x10000000)) {
        uVar6 = (ulong)uVar2 | uVar6 << 0x20;
        uVar12 = uVar11 | (uVar12 >> 3) << 0x20 | (uVar12 & 7) << 0x30;
        bVar10 = false;
      }
      else {
        uVar6 = 0;
        uVar12 = 0;
      }
    }
LAB_0026d701:
    raw = puVar3;
    local_48.int_value_ = uVar6;
    if (!bVar10) {
      do {
        local_48.size_ = (uint32_t)uVar12;
        local_48.type_ = (uint8_t)(uVar12 >> 0x30);
        local_48.id_ = (uint16_t)(uVar12 >> 0x20);
        if (local_48.id_ == 1) {
          *(byte *)&(this->_has_field_).super__Base_bitset<1UL>._M_w =
               (byte)(this->_has_field_).super__Base_bitset<1UL>._M_w | 2;
        }
        else if (local_48.id_ == 0) {
          return puVar8 == puVar3;
        }
        protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
                  (&local_48,&this->unknown_fields_);
        puVar7 = puVar3;
        do {
          puVar3 = puVar7;
          if (puVar8 <= puVar7) {
LAB_0026db11:
            local_48.int_value_ = 0;
            uVar12 = 0;
            bVar10 = false;
            goto LAB_0026da8c;
          }
          uVar12 = (ulong)(char)(byte)*puVar7;
          puVar9 = (ulong *)((long)puVar7 + 1);
          if ((long)uVar12 < 0) {
            uVar12 = (ulong)((byte)*puVar7 & 0x7f);
            bVar10 = false;
            puVar14 = puVar9;
            if ((char)(byte)*puVar7 < '\0') {
              lVar4 = 7;
              uVar11 = uVar12;
              puVar13 = puVar9;
              do {
                bVar10 = 0x38 < lVar4 - 7U || puVar8 <= puVar13;
                uVar12 = 0;
                puVar14 = puVar9;
                if (bVar10) break;
                uVar15 = *puVar13;
                puVar14 = (ulong *)((long)puVar13 + 1);
                uVar12 = uVar11 | (ulong)((byte)uVar15 & 0x7f) << ((byte)lVar4 & 0x3f);
                lVar4 = lVar4 + 7;
                uVar11 = uVar12;
                puVar13 = puVar14;
              } while ((char)(byte)uVar15 < '\0');
            }
            puVar9 = puVar14;
            if (bVar10) {
              puVar9 = puVar7;
              uVar12 = 0;
            }
            if (puVar9 == puVar7) goto LAB_0026db11;
          }
          uVar5 = (uint)(uVar12 >> 3);
          if ((uVar5 == 0) || (puVar8 <= puVar9)) {
switchD_0026d884_caseD_3:
            local_48.int_value_ = 0;
            bVar10 = false;
            uVar12 = 0;
            goto LAB_0026da8c;
          }
          switch((uint)uVar12 & 7) {
          case 0:
            uVar15 = 0;
            bVar10 = puVar9 >= puVar8;
            if (puVar9 < puVar8) {
              puVar14 = (ulong *)((long)puVar9 + 1);
              bVar1 = (byte)*puVar9;
              uVar16 = (ulong)(bVar1 & 0x7f);
              uVar17 = uVar16;
              if ((char)bVar1 < '\0') {
                uVar17 = 0;
              }
              uVar2 = (uint)uVar17;
              uVar11 = 0;
              puVar3 = puVar14;
              if ((char)bVar1 < '\0') {
                lVar4 = 7;
                puVar13 = puVar14;
                do {
                  uVar2 = (uint)uVar17;
                  bVar10 = 0x38 < lVar4 - 7U || puVar8 <= puVar13;
                  uVar11 = 0;
                  puVar3 = puVar14;
                  if (bVar10) break;
                  bVar1 = (byte)*puVar13;
                  puVar13 = (ulong *)((long)puVar13 + 1);
                  uVar16 = uVar16 | (ulong)(bVar1 & 0x7f) << ((byte)lVar4 & 0x3f);
                  uVar11 = uVar16 >> 0x20;
                  lVar4 = lVar4 + 7;
                  if (-1 < (char)bVar1) {
                    uVar17 = uVar16 & 0xffffffff;
                  }
                  uVar2 = (uint)uVar17;
                  puVar3 = puVar13;
                } while (-1 >= (char)bVar1);
              }
            }
            else {
              uVar2 = 0;
              uVar11 = 0;
            }
            if (bVar10) {
              uVar11 = 0;
              puVar3 = puVar9;
              uVar2 = 0;
            }
            if (puVar3 == puVar9) {
LAB_0026da11:
              uVar12 = 0;
              bVar10 = false;
              local_48.int_value_ = 0;
              puVar3 = puVar7;
              goto LAB_0026da8c;
            }
            break;
          case 1:
            puVar3 = puVar9 + 1;
            if (puVar8 < puVar3) {
LAB_0026db46:
              local_48.int_value_ = 0;
              uVar12 = 0;
              bVar10 = false;
              puVar3 = puVar7;
              goto LAB_0026da8c;
            }
            uVar15 = *puVar9;
            uVar11 = uVar15 >> 0x20;
            goto LAB_0026d8ee;
          case 2:
            bVar10 = puVar9 >= puVar8;
            uVar11 = uVar6;
            if (puVar9 < puVar8) {
              puVar14 = (ulong *)((long)puVar9 + 1);
              uVar15 = (ulong)((byte)*puVar9 & 0x7f);
              puVar3 = puVar14;
              uVar11 = uVar15;
              if ((char)(byte)*puVar9 < '\0') {
                lVar4 = 7;
                puVar13 = puVar14;
                do {
                  bVar10 = 0x38 < lVar4 - 7U || puVar8 <= puVar13;
                  puVar3 = puVar14;
                  uVar11 = uVar6;
                  if (bVar10) break;
                  uVar17 = *puVar13;
                  puVar13 = (ulong *)((long)puVar13 + 1);
                  uVar15 = uVar15 | (ulong)((byte)uVar17 & 0x7f) << ((byte)lVar4 & 0x3f);
                  lVar4 = lVar4 + 7;
                  puVar3 = puVar13;
                  uVar11 = uVar15;
                } while ((char)(byte)uVar17 < '\0');
              }
            }
            uVar6 = uVar11;
            if (bVar10) {
              puVar3 = puVar9;
              uVar6 = 0;
            }
            if ((puVar3 == puVar9) || ((ulong)((long)puVar8 - (long)puVar3) < uVar6)) {
              uVar2 = 0;
              uVar11 = 0;
              bVar10 = false;
              uVar15 = 0;
            }
            else {
              uVar11 = (ulong)puVar3 >> 0x20;
              uVar2 = (uint)puVar3;
              puVar3 = (ulong *)((long)puVar3 + uVar6);
              bVar10 = true;
              uVar15 = uVar6;
            }
            if (!bVar10) goto LAB_0026da11;
            break;
          default:
            goto switchD_0026d884_caseD_3;
          case 5:
            puVar3 = (ulong *)((long)puVar9 + 4);
            uVar11 = 0;
            if (puVar8 < puVar3) goto LAB_0026db46;
            uVar15 = (ulong)(uint)*puVar9;
LAB_0026d8ee:
            uVar2 = (uint)uVar15;
            uVar15 = 0;
          }
          bVar10 = true;
          if ((uVar5 < 0x10000) && (uVar15 < 0x10000000)) {
            local_48.int_value_ = (ulong)uVar2 | uVar11 << 0x20;
            uVar12 = uVar15 | (uVar12 >> 3) << 0x20 | (uVar12 & 7) << 0x30;
            bVar10 = false;
          }
          else {
            local_48.int_value_ = 0;
            uVar12 = 0;
          }
LAB_0026da8c:
          puVar7 = puVar3;
        } while (bVar10);
      } while( true );
    }
  } while( true );
}

Assistant:

bool StartTracingResponse::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}